

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::SPxWeightST<double>::setupWeights(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  Item *pIVar4;
  bool bVar5;
  Real RVar6;
  int iVar7;
  pointer pdVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  int *piVar13;
  double *pdVar14;
  long lVar15;
  long in_FS_OFFSET;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_d0;
  
  RVar6 = Tolerances::epsilon((base->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  if ((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.thenum
      < 1) {
    local_d0 = 1.0;
  }
  else {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    local_d0 = 1.0;
    lVar15 = 0;
    do {
      dVar17 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar15];
      ::soplex::infinity::__tls_init();
      if ((dVar17 < dVar1) &&
         (dVar17 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15]), local_d0 < dVar17)) {
        local_d0 = dVar17;
      }
      dVar17 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar15];
      ::soplex::infinity::__tls_init();
      if ((-dVar1 < dVar17) &&
         (dVar17 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15]), local_d0 < dVar17)) {
        local_d0 = dVar17;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  iVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  if (0 < iVar7) {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    lVar15 = 0;
    do {
      dVar17 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar15];
      ::soplex::infinity::__tls_init();
      if ((dVar17 < dVar1) &&
         (dVar17 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15]), local_d0 < dVar17)) {
        local_d0 = dVar17;
      }
      dVar17 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar15];
      ::soplex::infinity::__tls_init();
      if ((-dVar1 < dVar17) &&
         (dVar17 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15]), local_d0 < dVar17)) {
        local_d0 = dVar17;
      }
      lVar15 = lVar15 + 1;
      iVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum;
    } while (lVar15 < iVar7);
  }
  pdVar9 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = *(pointer *)
            ((long)&(base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  pdVar11 = pdVar9 + 1;
  if (base->theType * base->theRep < 1) {
    pdVar14 = pdVar9;
    if (pdVar11 != pdVar3 && pdVar9 != pdVar3) {
      do {
        pdVar9 = pdVar11;
        if (ABS(*pdVar11) <= ABS(*pdVar14)) {
          pdVar9 = pdVar14;
        }
        pdVar11 = pdVar11 + 1;
        pdVar14 = pdVar9;
      } while (pdVar11 != pdVar3);
    }
    dVar1 = *pdVar9;
    local_d0 = 0.01 / local_d0;
    lVar15 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar15) {
      dVar17 = *(double *)(in_FS_OFFSET + -8);
      dVar16 = -dVar17;
      lVar15 = lVar15 + 1;
      do {
        iVar7 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.theitem
                [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                 set.thekey[lVar15 + -2].idx].data.super_SVectorBase<double>.memused;
        dVar22 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2] * (1.0 / ABS(dVar1));
        dVar18 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        dVar20 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        ::soplex::infinity::__tls_init();
        dVar21 = (double)(iVar7 + -1) * local_d0 * 0.0001;
        dVar19 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        if (dVar17 <= dVar18) {
          ::soplex::infinity::__tls_init();
          if (dVar19 <= dVar16) {
            (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = (dVar21 + -10000.0) - ABS(dVar22);
          }
          else {
            dVar22 = 0.0 - dVar22;
LAB_002090c0:
            (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = dVar21 + dVar22 + dVar20 * local_d0;
            (this->colUp).data[lVar15 + -2] = false;
          }
        }
        else if (RVar6 <= ABS(dVar19 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up
                                       .val.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar15 + -2])) {
          ::soplex::infinity::__tls_init();
          dVar18 = dVar18 * local_d0;
          if (dVar19 <= dVar16) {
            dVar18 = dVar22 + (0.0 - dVar18);
          }
          else {
            if (dVar22 <= 0.0) {
              dVar22 = 1.0 - dVar22;
              goto LAB_002090c0;
            }
            dVar18 = (dVar22 + 1.0) - dVar18;
          }
          (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + -2] = dVar21 + dVar18;
          (this->colUp).data[lVar15 + -2] = true;
        }
        else {
          (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + -2] = ABS(dVar22) + dVar21 + 100000.0;
        }
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
    lVar15 = (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar15) {
      dVar17 = *(double *)(in_FS_OFFSET + -8);
      dVar16 = -dVar17;
      do {
        pIVar4 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 set.theitem;
        iVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thekey[lVar15 + -1].idx;
        lVar12 = (long)pIVar4[iVar7].data.super_SVectorBase<double>.memused;
        dVar18 = 0.0;
        if (0 < lVar12) {
          lVar10 = lVar12 + 1;
          piVar13 = &pIVar4[iVar7].data.super_SVectorBase<double>.m_elem[lVar12 + -1].idx;
          dVar20 = 0.0;
          do {
            dVar19 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[*piVar13] *
                     ((Nonzero<double> *)(piVar13 + -2))->val;
            dVar22 = dVar18 + dVar19;
            dVar20 = dVar20 + (dVar19 - (dVar22 - dVar18)) + (dVar18 - (dVar22 - (dVar22 - dVar18)))
            ;
            lVar10 = lVar10 + -1;
            piVar13 = piVar13 + -4;
            dVar18 = dVar22;
          } while (1 < lVar10);
          dVar18 = dVar22 + dVar20;
        }
        dVar20 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -1];
        dVar22 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -1] * local_d0;
        ::soplex::infinity::__tls_init();
        lVar12 = lVar15 + -1;
        dVar18 = dVar18 * (1.0 / ABS(dVar1));
        dVar19 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar12];
        if (dVar17 <= dVar20) {
          ::soplex::infinity::__tls_init();
          if (dVar19 <= dVar16) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = -100000.0 - ABS(dVar18);
          }
          else {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = (dVar22 + 0.0) - dVar18;
LAB_00209392:
            (this->rowRight).data[lVar12] = false;
          }
        }
        else if (RVar6 <= ABS(dVar19 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                       right.val.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar12])) {
          ::soplex::infinity::__tls_init();
          dVar20 = dVar20 * local_d0;
          if (dVar19 <= dVar16) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = (0.0 - dVar20) + dVar18;
          }
          else {
            if (dVar18 <= 0.0) {
              (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = dVar22 + (0.0 - dVar18);
              goto LAB_00209392;
            }
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = dVar18 - dVar20;
          }
          (this->rowRight).data[lVar12] = true;
        }
        else {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] = ABS(dVar18) + 10000.0;
        }
        bVar5 = 1 < lVar15;
        lVar15 = lVar12;
      } while (bVar5);
    }
  }
  else {
    if (pdVar11 != pdVar3 && pdVar9 != pdVar3) {
      do {
        pdVar14 = pdVar11;
        if (ABS(*pdVar11) <= ABS(*pdVar9)) {
          pdVar14 = pdVar9;
        }
        pdVar9 = pdVar14;
        pdVar11 = pdVar11 + 1;
      } while (pdVar11 != pdVar3);
    }
    local_d0 = 1.0 / local_d0;
    lVar15 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar15) {
      dVar1 = *pdVar9;
      dVar17 = *(double *)(in_FS_OFFSET + -8);
      dVar16 = -dVar17;
      lVar15 = lVar15 + 1;
      do {
        iVar2 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.theitem
                [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                 set.thekey[lVar15 + -2].idx].data.super_SVectorBase<double>.memused;
        dVar19 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2] * (0.001 / ABS(dVar1));
        dVar18 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        dVar22 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2] * local_d0;
        ::soplex::infinity::__tls_init();
        dVar21 = (double)(iVar2 + -1) * ((0.001 / ABS(dVar1)) / (double)iVar7);
        dVar20 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        if (dVar17 <= dVar18) {
          ::soplex::infinity::__tls_init();
          if (dVar20 <= dVar16) {
            dVar21 = (dVar21 + -10000.0) - ABS(dVar19);
            pdVar8 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
LAB_00208c89:
            pdVar8[lVar15 + -2] = dVar21;
          }
          else {
            (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = (dVar21 + dVar22 + 10.0) - dVar19;
            (this->colUp).data[lVar15 + -2] = false;
          }
        }
        else {
          if (RVar6 <= ABS(dVar20 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.
                                    val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar15 + -2])) {
            ::soplex::infinity::__tls_init();
            dVar18 = dVar18 * local_d0;
            if (dVar20 <= dVar16) {
              (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15 + -2] = dVar21 + dVar19 + (10.0 - dVar18);
              (this->colUp).data[lVar15 + -2] = true;
              goto LAB_00208cc4;
            }
            dVar21 = dVar21 + ((dVar22 + 10.0) - dVar18);
            pdVar8 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar8[lVar15 + -2] = dVar21;
            if (ABS(dVar22) <= ABS(dVar18)) {
              (this->colUp).data[lVar15 + -2] = false;
              dVar21 = dVar21 - dVar19;
              goto LAB_00208c89;
            }
            (this->colUp).data[lVar15 + -2] = true;
            dVar19 = dVar19 + dVar21;
          }
          else {
            dVar19 = ABS(dVar19) + dVar21 + 100000.0;
            pdVar8 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          pdVar8[lVar15 + -2] = dVar19;
        }
LAB_00208cc4:
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
    lVar15 = (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar15) {
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      dVar17 = -dVar1;
      lVar15 = lVar15 + 1;
      do {
        dVar16 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        ::soplex::infinity::__tls_init();
        dVar18 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2];
        if (dVar1 <= dVar16) {
          ::soplex::infinity::__tls_init();
          if (dVar18 <= dVar17) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = -100000.0;
          }
          else {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] =
                 (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15 + -2] * local_d0 + 0.0;
            (this->rowRight).data[lVar15 + -2] = false;
          }
        }
        else if (RVar6 <= ABS(dVar18 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                       right.val.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar15 + -2])) {
          ::soplex::infinity::__tls_init();
          dVar16 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15 + -2] * local_d0;
          if (dVar18 <= dVar17) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = 0.0 - dVar16;
            (this->rowRight).data[lVar15 + -2] = true;
          }
          else {
            dVar18 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15 + -2] * local_d0;
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + -2] = (dVar18 + 0.0) - dVar16;
            (this->rowRight).data[lVar15 + -2] = ABS(dVar16) < ABS(dVar18);
          }
        }
        else {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + -2] = 0.0;
        }
        lVar15 = lVar15 + -1;
      } while (1 < lVar15);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}